

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O2

int INT_EVstore_is_sending(CManager_conflict cm,EVstone stone_num,EVaction action_num)

{
  int iVar1;
  stone_type p_Var2;
  
  p_Var2 = stone_struct(cm->evp,stone_num);
  if (p_Var2 == (stone_type)0x0) {
    iVar1 = -1;
  }
  else {
    iVar1 = p_Var2->proto_actions[action_num].o.bri.remote_stone_id;
  }
  return iVar1;
}

Assistant:

int
INT_EVstore_is_sending(CManager cm, EVstone stone_num, EVaction action_num)
{
    event_path_data evp = cm->evp;
    stone_type stone;;
    proto_action *p;

    stone = stone_struct(evp, stone_num);
    if (!stone) return -1;

    p = &stone->proto_actions[action_num];
    return p->o.store.is_sending;
}